

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O2

bool backward_pawn<(Color)0>(int *row,int *col,U64 *pawns)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = *col;
  iVar7 = iVar1 + 1;
  uVar9 = 0xffffffffffffffff;
  if (6 < iVar1) {
    iVar7 = -1;
  }
  if (0 < iVar1) {
    uVar8 = *pawns & (&bitboards::col)[iVar1 - 1];
    while (uVar4 = (uint)uVar9, uVar8 != 0) {
      uVar3 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar8 = uVar8 & uVar8 - 1;
      if ((int)uVar3 < (int)uVar4) {
        uVar3 = uVar9;
      }
      uVar9 = uVar3 & 0xffffffff;
    }
    if (0 < (int)uVar4) {
      bVar2 = *row < (int)(uVar4 >> 3);
      goto LAB_001199e8;
    }
  }
  bVar2 = false;
LAB_001199e8:
  if (iVar7 == -1) {
    bVar5 = false;
    bVar6 = bVar2;
  }
  else {
    uVar9 = 0xffffffffffffffff;
    uVar8 = *pawns & (&bitboards::col)[iVar7];
    while (uVar4 = (uint)uVar9, uVar8 != 0) {
      uVar3 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar8 = uVar8 & uVar8 - 1;
      if ((int)uVar3 < (int)uVar4) {
        uVar3 = uVar9;
      }
      uVar9 = uVar3 & 0xffffffff;
    }
    if (((int)uVar4 < 1) || (bVar5 = true, (int)(uVar4 >> 3) <= *row)) {
      bVar5 = (*pawns & (&bitboards::col)[iVar7]) == 0;
    }
    bVar6 = false;
    if ((iVar1 < 1) && (bVar5)) {
      return true;
    }
  }
  return (bool)(bVar2 & bVar5 | bVar6);
}

Assistant:

inline bool backward_pawn(const int& row, const int& col, const U64& pawns) {
	int left = col - 1 < Col::A ? -1 : col - 1;
	int right = col + 1 > Col::H ? -1 : col + 1;
	bool left_greater = false;
	bool right_greater = false;

	if (c == white) {
		if (left != -1) {
			int sq = -1;
			U64 left_pawns = bitboards::col[left] & pawns;
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp > sq) sq = tmp;
			}
			left_greater = sq > 0 && util::row(sq) > row;
		}

		if (right != -1) {
			int sq = -1;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp > sq) sq = tmp;
			}
			right_greater = sq > 0 && util::row(sq) > row || no_right_pawns;
		}
	}
	else {
		if (left != -1) {
			int sq = 100;
			U64 left_pawns = bitboards::col[left] & pawns;
			bool no_left_pawns = (left_pawns == 0ULL);
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp < sq) sq = tmp;
			}
			left_greater = sq < 100 && util::row(sq) < row || no_left_pawns;
		}
		if (right != -1) {
			int sq = 100;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp < sq) sq = tmp;
			}
			right_greater = sq < 100 && util::row(sq) < row || no_right_pawns;
		}
	}

	return (left == -1 && right_greater) ||
		(right == -1 && left_greater) ||
		(left_greater && right_greater);
}